

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<ASTNode> __thiscall SchemeChar::to_AST(SchemeChar *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ASTNode> sVar1;
  undefined1 local_54 [4];
  string local_50;
  string local_30;
  
  local_54 = (undefined1  [4])0x6;
  char_to_char_name_abi_cxx11_(&local_30,*(uchar *)(in_RSI + 8));
  normalize_char_name((string *)(local_54 + 4),&local_30);
  std::make_shared<ASTNode,ast_type_t,std::__cxx11::string>
            ((ast_type_t *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_54);
  std::__cxx11::string::~string((string *)(local_54 + 4));
  std::__cxx11::string::~string((string *)&local_30);
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ASTNode>)sVar1.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ASTNode> SchemeChar::to_AST() const
{
    return std::make_shared<ASTNode>(ast_type_t::CHAR, normalize_char_name(char_to_char_name(value)));
}